

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::writeWord(Samba *this,uint32_t addr,uint32_t value)

{
  int iVar1;
  pointer pSVar2;
  SambaError *this_00;
  char local_38 [8];
  uint8_t cmd [20];
  uint32_t value_local;
  uint32_t addr_local;
  Samba *this_local;
  
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x,value=%#x)\n","writeWord",(ulong)addr,(ulong)value);
  }
  snprintf(local_38,0x14,"W%08X,%08X#",(ulong)addr,(ulong)value);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_38,0x13);
  if (iVar1 != 0x13) {
    this_00 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(this_00);
    __cxa_throw(this_00,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_isUsb & 1U) != 0) {
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    (*pSVar2->_vptr_SerialPort[10])();
  }
  return;
}

Assistant:

void
Samba::writeWord(uint32_t addr, uint32_t value)
{
    uint8_t cmd[20];

    if (_debug)
        printf("%s(addr=%#x,value=%#x)\n", __FUNCTION__, addr, value);

    snprintf((char*) cmd, sizeof(cmd), "W%08X,%08X#", addr, value);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

    // The SAM firmware has a bug that if the command and binary data
    // are received in the same USB data packet, then the firmware
    // gets confused.  Even though the writes are sperated in the code,
    // USB drivers often do write combining which can put them together
    // in the same USB data packet.  To avoid this, we call the serial
    // port object's flush method before writing the data.
    if (_isUsb)
        _port->flush();
}